

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

bool IsFileInDir(string *infile,string *indir)

{
  __type _Var1;
  bool bVar2;
  string dir;
  string file;
  string sStack_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  cmsys::SystemTools::CollapseFullPath(&local_48,infile);
  cmsys::SystemTools::CollapseFullPath(&sStack_68,indir);
  if (sStack_68._M_string_length < local_48._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_28,(ulong)&local_48);
    _Var1 = std::operator==(&local_28,&sStack_68);
    if (_Var1) {
      bVar2 = local_48._M_dataplus._M_p[sStack_68._M_string_length] == '/';
    }
    else {
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&local_28);
  }
  else {
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return bVar2;
}

Assistant:

bool IsFileInDir(const std::string &infile, const std::string &indir)
{
  std::string file = cmSystemTools::CollapseFullPath(infile);
  std::string dir = cmSystemTools::CollapseFullPath(indir);

  if (
    file.size() > dir.size() &&
    (fnc(file.substr(0, dir.size())) == fnc(dir)) &&
    file[dir.size()] == '/'
    )
    {
    return true;
    }

  return false;
}